

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

void summaryindex::indexevents
               (string *fullfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  FILE *__stream;
  bool bVar1;
  char *__filename;
  undefined8 uVar2;
  size_t sVar3;
  pointer ppVar4;
  reference piVar5;
  mapped_type *this;
  int local_a4 [2];
  sampleslevelRec sr;
  int period;
  const_iterator __end4;
  const_iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int local_78;
  summary_period k;
  _Self local_68;
  const_iterator iter;
  summarySampleslevelHeader sh;
  int summary_set;
  int samplesize;
  int stream_type;
  size_t i;
  long lStack_38;
  int summarycalcstream_type;
  longlong offset;
  FILE *fin;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *eventtoperiods_local;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *pmStack_18;
  int file_id_local;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_local;
  string *fullfilename_local;
  
  fin = (FILE *)eventtoperiods;
  eventtoperiods_local._4_4_ = file_id;
  pmStack_18 = summaryfileperiod_to_offset;
  summaryfileperiod_to_offset_local =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)fullfilename;
  __filename = (char *)std::__cxx11::string::c_str();
  offset = (longlong)fopen(__filename,"rb");
  __stream = _stderr;
  if ((FILE *)offset == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s: cannot open %s\n","indexevents",uVar2);
    exit(1);
  }
  lStack_38 = 0;
  i._4_4_ = 0;
  sVar3 = fread((void *)((long)&i + 4),4,1,(FILE *)offset);
  if (sVar3 != 0) {
    lStack_38 = lStack_38 + 4;
  }
  if ((i._4_4_ & 0x3000000) != 0x3000000) {
    fprintf(_stderr,"%s: Not a summarycalc stream type %d\n","indexevents",
            (ulong)(i._4_4_ & 0x3000000));
    exit(-1);
  }
  _samplesize = fread(&sh.expval,4,1,(FILE *)offset);
  if (_samplesize != 0) {
    lStack_38 = lStack_38 + 4;
  }
  sh.summary_id = 0;
  if (_samplesize != 0) {
    _samplesize = fread(&sh.summary_id,4,1,(FILE *)offset);
  }
  if (_samplesize != 0) {
    lStack_38 = lStack_38 + 4;
  }
  do {
    if (_samplesize == 0) {
      fclose((FILE *)offset);
      return;
    }
    _samplesize = fread(&iter,0xc,1,(FILE *)offset);
    if (_samplesize != 0) {
      local_68._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)fin,(key_type *)&iter);
      k._4_8_ = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)fin);
      bVar1 = std::operator!=(&local_68,(_Self *)&k.fileindex);
      if (bVar1) {
        __range4._4_4_ = iter._M_node._4_4_;
        local_78 = eventtoperiods_local._4_4_;
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator->(&local_68);
        __end4 = std::vector<int,_std::allocator<int>_>::begin(&ppVar4->second);
        register0x00000000 = std::vector<int,_std::allocator<int>_>::end(&ppVar4->second);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&sr.loss), bVar1) {
          piVar5 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          sr.sidx = *piVar5;
          k.summary_id = sr.sidx;
          this = std::
                 map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ::operator[](pmStack_18,(key_type *)((long)&__range4 + 4));
          std::vector<long_long,_std::allocator<long_long>_>::push_back
                    (this,&stack0xffffffffffffffc8);
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&__end4);
        }
      }
      lStack_38 = lStack_38 + 0xc;
    }
    do {
      if ((_samplesize == 0) || (_samplesize = fread(local_a4,8,1,(FILE *)offset), _samplesize == 0)
         ) break;
      lStack_38 = lStack_38 + 8;
    } while (local_a4[0] != 0);
  } while( true );
}

Assistant:

void indexevents(const std::string& fullfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {
		FILE* fin = fopen(fullfilename.c_str(), "rb");
		if (fin == NULL) {
			fprintf(stderr, "%s: cannot open %s\n", __func__, fullfilename.c_str());
			exit(EXIT_FAILURE);
		}
		long long offset = 0;
		int summarycalcstream_type = 0;
		size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
		if (i != 0) offset += sizeof(summarycalcstream_type);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			fprintf(stderr, "%s: Not a summarycalc stream type %d\n", __func__, stream_type);
			exit(-1);
		}

		stream_type = streamno_mask & summarycalcstream_type;
		int samplesize;
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 0) offset += sizeof(samplesize);
		int summary_set = 0;
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		if (i != 0) offset += sizeof(summary_set);
		summarySampleslevelHeader sh;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			if (i != 0) {
				auto iter = eventtoperiods.find(sh.event_id);
				if (iter != eventtoperiods.end()) {
					summary_period k;
					k.summary_id = sh.summary_id;
					k.fileindex = file_id;
					for (auto period : iter->second) {
						k.period_no = period;
						summaryfileperiod_to_offset[k].push_back(offset);
					}
				}
				offset += sizeof(sh);
			}
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i != 0) offset += sizeof(sr);
				if (i == 0) break;
				if (sr.sidx == 0) break;
			}
		}

		fclose(fin);
	}